

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

size_t Node_DataSize(node *p,dataid Id,datatype Type,void *Data,int QueryType)

{
  undefined8 in_RAX;
  size_t sVar1;
  
  if (2 < QueryType - 0x28U) {
    __assert_fail("QueryType==META_PARAM_GET || QueryType==META_PARAM_SET || QueryType==META_PARAM_UNSET"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x7c3,"size_t Node_DataSize(node *, dataid, datatype, const void *, int)");
  }
  if (Data == (void *)0x0) {
    return 0;
  }
  if ((Type - 0x1f < 2) || (Type == 4)) {
    sVar1 = tcsbytes((tchar_t *)Data);
    return sVar1;
  }
  if (Type != 0x1b) {
    sVar1 = Node_MaxDataSize(p,Id,Type,QueryType);
    return sVar1;
  }
  if (p != (node *)0x0) {
    sVar1 = (**(code **)(*p->VMT + 0xb0))(Data,Id,0x1b,in_RAX);
    return sVar1;
  }
  __assert_fail("(const void*)(p)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0x7ca,"size_t Node_DataSize(node *, dataid, datatype, const void *, int)");
}

Assistant:

NOINLINE size_t Node_DataSize(node* p, dataid Id, datatype Type, const void* Data, int QueryType)
{
    size_t Size;

    assert(QueryType==META_PARAM_GET || QueryType==META_PARAM_SET || QueryType==META_PARAM_UNSET);
    if (!Data)
        return 0;

    switch (Type)
    {
    case TYPE_EXPR:
        Size = Node_Context(p)->ExprSize((nodeexpr*)Data);
        break;

    case TYPE_EXPRSTRING:
    case TYPE_EXPRPARAM:
    case TYPE_STRING:
        Size = tcsbytes((const tchar_t*)Data);
        break;

    default:
        Size = Node_MaxDataSize(p,Id,Type,QueryType);
        break;
    }
    return Size;
}